

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_send(ptls_t *tls,ptls_buffer_t *sendbuf,void *input,size_t inlen)

{
  st_ptls_traffic_protection_t *enc;
  byte bVar1;
  ptls_buffer_t *ppVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  byte local_7a [2];
  ptls_buffer_t *local_78;
  size_t local_70;
  size_t local_68;
  st_ptls_record_message_emitter_t emitter;
  
  if ((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) {
    __assert_fail("tls->traffic_protection.enc.aead != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x17ff,"int ptls_send(ptls_t *, ptls_buffer_t *, const void *, size_t)");
  }
  if ((0xffffff < (tls->traffic_protection).enc.seq) &&
     (tls->key_schedule != (ptls_key_schedule_t *)0x0)) {
    tls->field_0x1e8 = tls->field_0x1e8 | 8;
  }
  enc = &(tls->traffic_protection).enc;
  bVar1 = tls->field_0x1e8;
  if ((bVar1 & 8) == 0) {
LAB_0011232e:
    iVar3 = buffer_push_encrypted_records(sendbuf,'\x17',(uint8_t *)input,inlen,enc);
  }
  else {
    emitter.super.record_header_length = 5;
    emitter.super.begin_message = begin_record_message;
    emitter.super.commit_message = commit_record_message;
    emitter.rec_start = 0;
    local_68 = sendbuf->off;
    emitter.super.buf = sendbuf;
    emitter.super.enc = enc;
    iVar3 = begin_record_message(&emitter.super);
    if (iVar3 == 0) {
      local_7a[1] = 0x18;
      local_78 = emitter.super.buf;
      iVar3 = ptls_buffer__do_pushv(emitter.super.buf,local_7a + 1,1);
      if (iVar3 == 0) {
        iVar3 = ptls_buffer__do_pushv(local_78,"",3);
        ppVar2 = local_78;
        if (iVar3 == 0) {
          local_70 = local_78->off;
          local_7a[0] = bVar1 >> 4 & 1;
          iVar3 = ptls_buffer__do_pushv(local_78,local_7a,1);
          if (iVar3 == 0) {
            uVar5 = ppVar2->off - local_70;
            iVar3 = 0x20c;
            if (uVar5 < 0x1000000) {
              sVar6 = local_70;
              for (lVar4 = 0x10; lVar4 != -8; lVar4 = lVar4 + -8) {
                ppVar2->base[sVar6 - 3] = (uint8_t)(uVar5 >> ((byte)lVar4 & 0x3f));
                sVar6 = sVar6 + 1;
              }
              iVar3 = (*emitter.super.commit_message)(&emitter.super);
              if (iVar3 == 0) {
                iVar3 = update_traffic_key(tls,1);
                if (iVar3 == 0) {
                  tls->field_0x1e8 = tls->field_0x1e8 & 0xe7;
                  goto LAB_0011232e;
                }
              }
            }
          }
        }
      }
    }
    (emitter.super.buf)->off = local_68;
  }
  return iVar3;
}

Assistant:

int ptls_send(ptls_t *tls, ptls_buffer_t *sendbuf, const void *input, size_t inlen)
{
    assert(tls->traffic_protection.enc.aead != NULL);

    /* "For AES-GCM, up to 2^24.5 full-size records (about 24 million) may be encrypted on a given connection while keeping a
     * safety margin of approximately 2^-57 for Authenticated Encryption (AE) security." (RFC 8446 section 5.5).
     *
     * Key updates do not happen with tls 1.2, check `key_schedule` to see if we are using tls/1.3
     */
    if (tls->traffic_protection.enc.seq >= 16777216 && tls->key_schedule != NULL)
        tls->needs_key_update = 1;

    if (tls->needs_key_update) {
        int ret;
        if ((ret = update_send_key(tls, sendbuf, tls->key_update_send_request)) != 0)
            return ret;
        tls->needs_key_update = 0;
        tls->key_update_send_request = 0;
    }

    return buffer_push_encrypted_records(sendbuf, PTLS_CONTENT_TYPE_APPDATA, input, inlen, &tls->traffic_protection.enc);
}